

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ReLU_x86_fma::forward_inplace(ReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [32];
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  auVar4 = _DAT_005f1c20;
  auVar18 = _DAT_005f1c00;
  iVar11 = bottom_top_blob->elempack;
  if ((iVar11 == 0) || (iVar7 = (int)bottom_top_blob->elemsize << 3, iVar7 / iVar11 != 8)) {
    uVar2 = bottom_top_blob->c;
    uVar8 = iVar11 * bottom_top_blob->w * bottom_top_blob->h * bottom_top_blob->d;
    if ((this->super_ReLU).slope == 0.0) {
      if (0 < (int)uVar2) {
        uVar9 = 0;
        auVar19._8_8_ = 0x8000000000000000;
        auVar19._0_8_ = 0x8000000000000000;
        auVar17 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
        do {
          pauVar10 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          if ((int)uVar8 < 8) {
            uVar13 = 0;
          }
          else {
            iVar11 = 7;
            do {
              auVar3 = vmaxps_avx(ZEXT432(0) << 0x40,*pauVar10);
              *pauVar10 = auVar3;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + 8;
              uVar13 = uVar8 & 0xfffffff8;
            } while (iVar11 < (int)uVar8);
          }
          uVar12 = uVar13 | 3;
          while ((int)uVar12 < (int)uVar8) {
            auVar20 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*pauVar10);
            *(undefined1 (*) [16])*pauVar10 = auVar20;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
            uVar12 = uVar13 + 7;
            uVar13 = uVar13 + 4;
          }
          if ((int)uVar13 < (int)uVar8) {
            uVar14 = CONCAT44(0,~uVar13 + uVar8);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = uVar14;
            auVar6 = vpshufd_avx(auVar20,0x44);
            auVar20 = vorps_avx(auVar6,auVar19);
            auVar5 = vorps_avx(auVar6,auVar19);
            auVar6 = vorps_avx(auVar6,auVar19);
            uVar15 = 0;
            do {
              auVar21._8_8_ = 0;
              auVar21._0_8_ = uVar15;
              auVar21 = vpshufd_avx(auVar21,0x44);
              auVar23._16_16_ = auVar21;
              auVar23._0_16_ = auVar21;
              auVar3 = vorps_avx(auVar23,auVar18);
              auVar23 = vorps_avx(auVar23,auVar4);
              auVar26._0_8_ = auVar23._16_8_ ^ 0x8000000000000000;
              auVar26._8_4_ = auVar23._24_4_;
              auVar26._12_4_ = auVar23._28_4_ ^ 0x80000000;
              auVar21 = vpcmpgtq_avx(auVar26,auVar20);
              auVar22._0_8_ = auVar23._0_8_ ^ 0x8000000000000000;
              auVar22._8_4_ = auVar23._8_4_;
              auVar22._12_4_ = auVar23._12_4_ ^ 0x80000000;
              auVar22 = vpcmpgtq_avx(auVar22,auVar5);
              auVar21 = vpackssdw_avx(auVar22,auVar21);
              auVar27._0_8_ = auVar3._16_8_ ^ 0x8000000000000000;
              auVar27._8_4_ = auVar3._24_4_;
              auVar27._12_4_ = auVar3._28_4_ ^ 0x80000000;
              auVar22 = vpcmpgtq_avx(auVar27,auVar20);
              auVar25._0_8_ = auVar3._0_8_ ^ 0x8000000000000000;
              auVar25._8_4_ = auVar3._8_4_;
              auVar25._12_4_ = auVar3._12_4_ ^ 0x80000000;
              auVar25 = vpcmpgtq_avx(auVar25,auVar6);
              auVar22 = vpackssdw_avx(auVar25,auVar22);
              auVar21 = vpackssdw_avx(auVar22 ^ auVar17,auVar21 ^ auVar17);
              auVar22 = vpmovsxwd_avx(auVar21);
              auVar21 = vpunpckhwd_avx(auVar21,auVar21);
              auVar24._16_16_ = auVar21;
              auVar24._0_16_ = auVar22;
              auVar3 = vmaskmovps_avx(auVar24,*(undefined1 (*) [32])(*pauVar10 + uVar15 * 4));
              auVar3 = vmaxps_avx(auVar3,ZEXT432(0) << 0x40);
              auVar3 = vmaskmovps_avx(auVar24,auVar3);
              *(undefined1 (*) [32])(*pauVar10 + uVar15 * 4) = auVar3;
              uVar15 = uVar15 + 8;
            } while ((uVar14 + 8 & 0xfffffffffffffff8) != uVar15);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar2);
      }
    }
    else if (0 < (int)uVar2) {
      uVar9 = 0;
      do {
        pauVar10 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar8 < 8) {
          uVar13 = 0;
        }
        else {
          fVar1 = (this->super_ReLU).slope;
          auVar18._4_4_ = fVar1;
          auVar18._0_4_ = fVar1;
          auVar18._8_4_ = fVar1;
          auVar18._12_4_ = fVar1;
          auVar18._16_4_ = fVar1;
          auVar18._20_4_ = fVar1;
          auVar18._24_4_ = fVar1;
          auVar18._28_4_ = fVar1;
          iVar11 = 7;
          do {
            auVar4 = vmaxps_avx(*pauVar10,ZEXT432(0) << 0x40);
            auVar3 = vminps_avx(*pauVar10,ZEXT432(0) << 0x40);
            auVar17 = vfmadd213ps_fma(auVar3,auVar18,auVar4);
            *pauVar10 = ZEXT1632(auVar17);
            pauVar10 = pauVar10 + 1;
            iVar11 = iVar11 + 8;
            uVar13 = uVar8 & 0xfffffff8;
          } while (iVar11 < (int)uVar8);
        }
        if ((int)(uVar13 | 3) < (int)uVar8) {
          fVar1 = (this->super_ReLU).slope;
          auVar17._4_4_ = fVar1;
          auVar17._0_4_ = fVar1;
          auVar17._8_4_ = fVar1;
          auVar17._12_4_ = fVar1;
          uVar12 = uVar13;
          do {
            auVar19 = vmaxps_avx(*(undefined1 (*) [16])*pauVar10,ZEXT816(0));
            auVar20 = vminps_avx(*(undefined1 (*) [16])*pauVar10,ZEXT816(0));
            auVar19 = vfmadd213ps_fma(auVar20,auVar17,auVar19);
            *(undefined1 (*) [16])*pauVar10 = auVar19;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
            uVar13 = uVar12 + 4;
            iVar11 = uVar12 + 7;
            uVar12 = uVar13;
          } while (iVar11 < (int)uVar8);
        }
        if (uVar8 - uVar13 != 0 && (int)uVar13 <= (int)uVar8) {
          lVar16 = 0;
          do {
            if (*(float *)(*pauVar10 + lVar16 * 4) < 0.0) {
              *(float *)(*pauVar10 + lVar16 * 4) =
                   *(float *)(*pauVar10 + lVar16 * 4) * (this->super_ReLU).slope;
            }
            lVar16 = lVar16 + 1;
          } while (uVar8 - uVar13 != (int)lVar16);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar2);
    }
  }
  else {
    forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar7 % (long)iVar11 & 0xffffffff));
  }
  return 0;
}

Assistant:

int ReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}